

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImStristr(char *haystack,char *haystack_end,char *needle,char *needle_end)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  
  if (needle_end == (char *)0x0) {
    sVar6 = strlen(needle);
    needle_end = needle + sVar6;
  }
  iVar3 = toupper((int)*needle);
  do {
    if (haystack_end == (char *)0x0) {
      cVar2 = *haystack;
      if (cVar2 == '\0') {
        return (char *)0x0;
      }
    }
    else {
      if (haystack_end <= haystack) {
        return (char *)0x0;
      }
      cVar2 = *haystack;
    }
    iVar4 = toupper((int)cVar2);
    if (iVar4 == (char)iVar3) {
      lVar7 = 1;
      do {
        pcVar1 = needle + lVar7;
        if (needle_end <= pcVar1) break;
        iVar4 = toupper((int)haystack[lVar7]);
        iVar5 = toupper((int)*pcVar1);
        lVar7 = lVar7 + 1;
      } while (iVar4 == iVar5);
      if (pcVar1 == needle_end) {
        return haystack;
      }
    }
    haystack = haystack + 1;
  } while( true );
}

Assistant:

const char* ImStristr(const char* haystack, const char* haystack_end, const char* needle, const char* needle_end)
{
    if (!needle_end)
        needle_end = needle + strlen(needle);

    const char un0 = (char)toupper(*needle);
    while ((!haystack_end && *haystack) || (haystack_end && haystack < haystack_end))
    {
        if (toupper(*haystack) == un0)
        {
            const char* b = needle + 1;
            for (const char* a = haystack + 1; b < needle_end; a++, b++)
                if (toupper(*a) != toupper(*b))
                    break;
            if (b == needle_end)
                return haystack;
        }
        haystack++;
    }
    return NULL;
}